

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

int __thiscall cmake::AddCMakePaths(cmake *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmCacheManager *pcVar2;
  pointer pcVar3;
  bool bVar4;
  string *psVar5;
  int iVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_40;
  
  pcVar2 = this->CacheManager;
  paVar1 = &local_40.field_2;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"CMAKE_COMMAND","");
  psVar5 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
  cmCacheManager::AddCacheEntry
            (pcVar2,&local_40,(psVar5->_M_dataplus)._M_p,"Path to CMake executable.",INTERNAL);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = this->CacheManager;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"CMAKE_CTEST_COMMAND","");
  psVar5 = cmSystemTools::GetCTestCommand_abi_cxx11_();
  cmCacheManager::AddCacheEntry
            (pcVar2,&local_40,(psVar5->_M_dataplus)._M_p,"Path to ctest program executable.",
             INTERNAL);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = this->CacheManager;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"CMAKE_CPACK_COMMAND","");
  psVar5 = cmSystemTools::GetCPackCommand_abi_cxx11_();
  cmCacheManager::AddCacheEntry
            (pcVar2,&local_40,(psVar5->_M_dataplus)._M_p,"Path to cpack program executable.",
             INTERNAL);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  psVar5 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
  pcVar3 = (psVar5->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar3,pcVar3 + psVar5->_M_string_length);
  std::__cxx11::string::append((char *)&local_40);
  bVar4 = cmsys::SystemTools::FileExists(local_40._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (bVar4) {
    pcVar2 = this->CacheManager;
    local_40._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"CMAKE_ROOT","");
    psVar5 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
    cmCacheManager::AddCacheEntry
              (pcVar2,&local_40,(psVar5->_M_dataplus)._M_p,"Path to CMake installation.",INTERNAL);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    iVar6 = 1;
  }
  else {
    psVar5 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
    iVar6 = 0;
    cmSystemTools::Error
              ("Could not find CMAKE_ROOT !!!\nCMake has most likely not been installed correctly.\nModules directory not found in\n"
               ,(psVar5->_M_dataplus)._M_p,(char *)0x0,(char *)0x0);
  }
  return iVar6;
}

Assistant:

int cmake::AddCMakePaths()
{
  // Save the value in the cache
  this->CacheManager->AddCacheEntry
    ("CMAKE_COMMAND", cmSystemTools::GetCMakeCommand().c_str(),
     "Path to CMake executable.", cmState::INTERNAL);
#ifdef CMAKE_BUILD_WITH_CMAKE
  this->CacheManager->AddCacheEntry
    ("CMAKE_CTEST_COMMAND", cmSystemTools::GetCTestCommand().c_str(),
     "Path to ctest program executable.", cmState::INTERNAL);
  this->CacheManager->AddCacheEntry
    ("CMAKE_CPACK_COMMAND", cmSystemTools::GetCPackCommand().c_str(),
     "Path to cpack program executable.", cmState::INTERNAL);
#endif
  if(!cmSystemTools::FileExists(
       (cmSystemTools::GetCMakeRoot()+"/Modules/CMake.cmake").c_str()))
    {
    // couldn't find modules
    cmSystemTools::Error("Could not find CMAKE_ROOT !!!\n"
      "CMake has most likely not been installed correctly.\n"
      "Modules directory not found in\n",
      cmSystemTools::GetCMakeRoot().c_str());
    return 0;
    }
  this->CacheManager->AddCacheEntry
    ("CMAKE_ROOT", cmSystemTools::GetCMakeRoot().c_str(),
     "Path to CMake installation.", cmState::INTERNAL);

  return 1;
}